

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O2

int struct_size_field_list(FMFieldList list,int pointer_size)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  int dimen_count;
  int iVar6;
  int ret;
  uint local_44;
  long elements;
  
  lVar5 = 0;
  iVar2 = 0;
  do {
    if (list[lVar5].field_name == (char *)0x0) {
      return iVar2;
    }
    bVar1 = false;
    iVar6 = 0;
    while( true ) {
      bVar4 = true;
      do {
        if (!bVar4) {
          iVar6 = 8;
          if (bVar1) goto LAB_0013d989;
          goto LAB_0013d96e;
        }
        uVar3 = IOget_array_size_dimen(list[lVar5].field_type,list,iVar6);
        iVar6 = iVar6 + 1;
        bVar4 = false;
      } while (uVar3 == 0);
      if ((uVar3 & local_44) == 0xffffffff) break;
      if (local_44 != 0xffffffff) {
        bVar1 = true;
      }
    }
LAB_0013d96e:
    FMarray_str_to_data_type(list[lVar5].field_type,&elements);
    iVar6 = list[lVar5].field_size * (int)elements;
    if (iVar6 < 1) {
      __assert_fail("field_size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_compat.c"
                    ,0x48,"int struct_size_field_list(FMFieldList, int)");
    }
LAB_0013d989:
    iVar6 = iVar6 + list[lVar5].field_offset;
    if (iVar2 <= iVar6) {
      iVar2 = iVar6;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static
int
struct_size_field_list(FMFieldList list, int pointer_size)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if (is_var_array_field(list, i) == 1) {
	    /* variant array, real_field_size is ioformat->pointer_size */
	    field_size = pointer_size;
	} else {
	    long elements;
	    FMarray_str_to_data_type(list[i].field_type, &elements);
	    field_size = list[i].field_size * elements;
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
/*	printf("i=%d field_name=%s field_type=%s struct_size= %d, offset=%d size=%d\n", i, list[i].field_name, list[i].field_type, struct_size, list[i].field_offset, field_size);*/
	i++;
    }
    return struct_size;
}